

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  bool bVar1;
  cmState *pcVar2;
  char *pcVar3;
  ostream *os;
  char *local_118;
  allocator local_d1;
  string local_d0;
  string local_b0;
  undefined1 local_80 [8];
  cmListFileContext lfc;
  cmOutputConverter converter;
  ostream *out_local;
  cmListFileBacktrace *this_local;
  
  if (this->Cur != (Entry *)0x0) {
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)&lfc.Line,&this->Bottom);
    cmListFileContext::cmListFileContext
              ((cmListFileContext *)local_80,&this->Cur->super_cmListFileContext);
    pcVar2 = cmStateSnapshot::GetState(&this->Bottom);
    bVar1 = cmState::GetIsInTryCompile(pcVar2);
    if (!bVar1) {
      pcVar2 = cmStateSnapshot::GetState(&this->Bottom);
      pcVar3 = cmState::GetSourceDirectory(pcVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,pcVar3,&local_d1);
      cmOutputConverter::ConvertToRelativePath
                (&local_b0,(cmOutputConverter *)&lfc.Line,&local_d0,
                 (string *)((long)&lfc.Name.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    if (lfc.FilePath.field_2._8_8_ == 0) {
      local_118 = " in ";
    }
    else {
      local_118 = " at ";
    }
    os = std::operator<<(out,local_118);
    ::operator<<(os,(cmListFileContext *)local_80);
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_80);
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  if (!this->Cur) {
    return;
  }
  cmOutputConverter converter(this->Bottom);
  cmListFileContext lfc = *this->Cur;
  if (!this->Bottom.GetState()->GetIsInTryCompile()) {
    lfc.FilePath = converter.ConvertToRelativePath(
      this->Bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
  }
  out << (lfc.Line ? " at " : " in ") << lfc;
}